

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O0

int webrtc::ConvertFloatToByteArray(float value,uint8_t *out_bytes)

{
  ulong local_28;
  size_t i;
  uint32_t binary_value;
  uint8_t *out_bytes_local;
  float value_local;
  
  if (out_bytes == (uint8_t *)0x0) {
    out_bytes_local._4_4_ = -1;
  }
  else {
    out_bytes_local._0_4_ = value;
    i._4_4_ = bit_cast<unsigned_int,float>((float *)&out_bytes_local);
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      out_bytes[local_28] = (uint8_t)i._4_4_;
      i._4_4_ = i._4_4_ >> 8;
    }
    out_bytes_local._4_4_ = 0;
  }
  return out_bytes_local._4_4_;
}

Assistant:

int ConvertFloatToByteArray(float value, uint8_t out_bytes[4]) {
  if (!out_bytes) {
    return -1;
  }

  uint32_t binary_value = bit_cast<uint32_t>(value);
  for (size_t i = 0; i < 4; ++i) {
    out_bytes[i] = binary_value;
    binary_value >>= 8;
  }

  return 0;
}